

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

int32_t pointerTOCPrefixBinarySearch(char *s,PointerTOCEntry *toc,int32_t count)

{
  int32_t iVar1;
  int32_t local_44;
  int32_t local_3c;
  int32_t cmp;
  int32_t prefixLength;
  int32_t i;
  int32_t limitPrefixLength;
  int32_t startPrefixLength;
  int32_t limit;
  int32_t start;
  int32_t count_local;
  PointerTOCEntry *toc_local;
  char *s_local;
  
  startPrefixLength = 0;
  i = 0;
  prefixLength = 0;
  if (count == 0) {
    s_local._4_4_ = -1;
  }
  else {
    limitPrefixLength = count;
    limit = count;
    _start = toc;
    toc_local = (PointerTOCEntry *)s;
    iVar1 = strcmpAfterPrefix(s,toc->entryName,&i);
    if (iVar1 == 0) {
      s_local._4_4_ = 0;
    }
    else {
      startPrefixLength = startPrefixLength + 1;
      limitPrefixLength = limitPrefixLength + -1;
      iVar1 = strcmpAfterPrefix((char *)toc_local,_start[limitPrefixLength].entryName,&prefixLength)
      ;
      if (iVar1 == 0) {
        s_local._4_4_ = limitPrefixLength;
      }
      else {
        while (startPrefixLength < limitPrefixLength) {
          cmp = (startPrefixLength + limitPrefixLength) / 2;
          if (i < prefixLength) {
            local_44 = i;
          }
          else {
            local_44 = prefixLength;
          }
          local_3c = local_44;
          iVar1 = strcmpAfterPrefix((char *)toc_local,_start[cmp].entryName,&local_3c);
          if (iVar1 < 0) {
            limitPrefixLength = cmp;
            prefixLength = local_3c;
          }
          else {
            if (iVar1 == 0) {
              return cmp;
            }
            startPrefixLength = cmp + 1;
            i = local_3c;
          }
        }
        s_local._4_4_ = -1;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int32_t
pointerTOCPrefixBinarySearch(const char *s, const PointerTOCEntry *toc, int32_t count) {
    int32_t start=0;
    int32_t limit=count;
    /*
     * Remember the shared prefix between s, start and limit,
     * and don't compare that shared prefix again.
     * The shared prefix should get longer as we narrow the [start, limit[ range.
     */
    int32_t startPrefixLength=0;
    int32_t limitPrefixLength=0;
    if(count==0) {
        return -1;
    }
    /*
     * Prime the prefix lengths so that we don't keep prefixLength at 0 until
     * both the start and limit indexes have moved.
     * At the same time, we find if s is one of the start and (limit-1) names,
     * and if not, exclude them from the actual binary search.
     */
    if(0==strcmpAfterPrefix(s, toc[0].entryName, &startPrefixLength)) {
        return 0;
    }
    ++start;
    --limit;
    if(0==strcmpAfterPrefix(s, toc[limit].entryName, &limitPrefixLength)) {
        return limit;
    }
    while(start<limit) {
        int32_t i=(start+limit)/2;
        int32_t prefixLength=MIN(startPrefixLength, limitPrefixLength);
        int32_t cmp=strcmpAfterPrefix(s, toc[i].entryName, &prefixLength);
        if(cmp<0) {
            limit=i;
            limitPrefixLength=prefixLength;
        } else if(cmp==0) {
            return i;
        } else {
            start=i+1;
            startPrefixLength=prefixLength;
        }
    }
    return -1;
}